

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

int __thiscall
slang::SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>::copy
          (SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  CaseItem *__ifirst;
  uninitialized_copy_result<const_slang::ast::RandSeqProductionSymbol::CaseItem_*,_slang::ast::RandSeqProductionSymbol::CaseItem_*>
  uVar1;
  pointer dest;
  undefined1 in_stack_ffffffffffffffc8 [16];
  BumpAllocator *in_stack_ffffffffffffffd8;
  int local_10;
  
  if (this->len == 0) {
    std::span<slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL>::span
              ((span<slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL> *)
               0x3f4559);
  }
  else {
    __ifirst = (CaseItem *)
               BumpAllocator::allocate
                         (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffc8._8_8_,
                          in_stack_ffffffffffffffc8._0_8_);
    begin(this);
    end(this);
    uVar1 = std::ranges::__uninitialized_copy_fn::
            operator()<const_slang::ast::RandSeqProductionSymbol::CaseItem_*,_const_slang::ast::RandSeqProductionSymbol::CaseItem_*,_slang::ast::RandSeqProductionSymbol::CaseItem_*,_slang::ast::RandSeqProductionSymbol::CaseItem_*>
                      ((__uninitialized_copy_fn *)dst,__ifirst,in_stack_ffffffffffffffc8._8_8_,
                       in_stack_ffffffffffffffc8._0_8_,(CaseItem *)this);
    std::span<slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL>::
    span<slang::ast::RandSeqProductionSymbol::CaseItem_*>
              ((span<slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL> *)
               uVar1.out,uVar1.in,(size_type)this);
  }
  return local_10;
}

Assistant:

[[nodiscard]] std::span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::ranges::uninitialized_copy(begin(), end(), dest, dest + len);

        return std::span<T>(dest, len);
    }